

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tool_writeout.c
# Opt level: O1

int writeLong(FILE *stream,writeoutvar *wovar,per_transfer *per,CURLcode per_result,_Bool use_json)

{
  writeoutid wVar1;
  int iVar2;
  char *pcVar3;
  char *pcVar4;
  long longinfo;
  char *local_28;
  
  local_28 = (char *)0x0;
  if (wovar->ci == CURLINFO_NONE) {
    wVar1 = wovar->id;
    if ((int)wVar1 < 0x2d) {
      if (wVar1 == VAR_EXITCODE) {
        pcVar3 = (char *)(ulong)per_result;
      }
      else {
        if (wVar1 != VAR_NUM_CERTS) goto LAB_0011e8a5;
        certinfo(per);
        if (per->certinfo == (curl_certinfo *)0x0) {
          pcVar3 = (char *)0x0;
        }
        else {
          pcVar3 = (char *)(long)per->certinfo->num_of_certs;
        }
      }
    }
    else if (wVar1 == VAR_NUM_HEADERS) {
      pcVar3 = (char *)per->num_headers;
    }
    else if (wVar1 == VAR_URLNUM) {
      pcVar3 = (char *)(long)(int)per->urlnum;
      if ((long)(int)per->urlnum < 0) goto LAB_0011e8a5;
    }
    else {
      if (wVar1 != VAR_NUM_RETRY) {
LAB_0011e8a5:
        if (!use_json) {
          return 1;
        }
        pcVar4 = "\"%s\":null";
        pcVar3 = wovar->name;
        goto LAB_0011e958;
      }
      pcVar3 = (char *)per->num_retries;
    }
  }
  else {
    iVar2 = curl_easy_getinfo(per->curl,wovar->ci,&local_28);
    pcVar3 = local_28;
    if (iVar2 != 0) goto LAB_0011e8a5;
  }
  local_28 = pcVar3;
  if (use_json) {
    curl_mfprintf(stream,"\"%s\":%ld",wovar->name,local_28);
    return 1;
  }
  pcVar3 = local_28;
  if (wovar->id - VAR_HTTP_CODE < 2) {
    pcVar4 = "%03ld";
  }
  else {
    pcVar4 = "%ld";
  }
LAB_0011e958:
  curl_mfprintf(stream,pcVar4,pcVar3);
  return 1;
}

Assistant:

static int writeLong(FILE *stream, const struct writeoutvar *wovar,
                     struct per_transfer *per, CURLcode per_result,
                     bool use_json)
{
  bool valid = false;
  long longinfo = 0;

  DEBUGASSERT(wovar->writefunc == writeLong);

  if(wovar->ci) {
    if(!curl_easy_getinfo(per->curl, wovar->ci, &longinfo))
      valid = true;
  }
  else {
    switch(wovar->id) {
    case VAR_NUM_RETRY:
      longinfo = per->num_retries;
      valid = true;
      break;
    case VAR_NUM_CERTS:
      certinfo(per);
      longinfo = per->certinfo ? per->certinfo->num_of_certs : 0;
      valid = true;
      break;
    case VAR_NUM_HEADERS:
      longinfo = per->num_headers;
      valid = true;
      break;
    case VAR_EXITCODE:
      longinfo = (long)per_result;
      valid = true;
      break;
    case VAR_URLNUM:
      if(per->urlnum <= INT_MAX) {
        longinfo = (long)per->urlnum;
        valid = true;
      }
      break;
    default:
      DEBUGASSERT(0);
      break;
    }
  }

  if(valid) {
    if(use_json)
      fprintf(stream, "\"%s\":%ld", wovar->name, longinfo);
    else {
      if(wovar->id == VAR_HTTP_CODE || wovar->id == VAR_HTTP_CODE_PROXY)
        fprintf(stream, "%03ld", longinfo);
      else
        fprintf(stream, "%ld", longinfo);
    }
  }
  else {
    if(use_json)
      fprintf(stream, "\"%s\":null", wovar->name);
  }

  return 1; /* return 1 if anything was written */
}